

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_StoDelete(Of_Man_t *p)

{
  void *__ptr;
  void **__ptr_00;
  int *piVar1;
  Vec_Mem_t *pVVar2;
  long lVar3;
  
  if (0 < (p->vPages).nSize) {
    lVar3 = 0;
    do {
      __ptr = (p->vPages).pArray[lVar3];
      if ((void *)0x2 < __ptr) {
        free(__ptr);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vPages).nSize);
  }
  __ptr_00 = (p->vPages).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vPages).pArray = (void **)0x0;
  }
  (p->vPages).nCap = 0;
  (p->vPages).nSize = 0;
  piVar1 = (p->vCutSets).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutSets).pArray = (int *)0x0;
  }
  (p->vCutSets).nCap = 0;
  (p->vCutSets).nSize = 0;
  piVar1 = (p->vCutFlows).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutFlows).pArray = (int *)0x0;
  }
  (p->vCutFlows).nCap = 0;
  (p->vCutFlows).nSize = 0;
  piVar1 = (p->vCutDelays).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutDelays).pArray = (int *)0x0;
  }
  (p->vCutDelays).nCap = 0;
  (p->vCutDelays).nSize = 0;
  piVar1 = (p->vCutRefs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutRefs).pArray = (int *)0x0;
  }
  (p->vCutRefs).nCap = 0;
  (p->vCutRefs).nSize = 0;
  if (p->pObjs != (Of_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Of_Obj_t *)0x0;
  }
  if ((p->pPars->fCutMin != 0) && (pVVar2 = p->vTtMem, pVVar2 != (Vec_Mem_t *)0x0)) {
    if (pVVar2->vTable != (Vec_Int_t *)0x0) {
      piVar1 = pVVar2->vTable->pArray;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        pVVar2->vTable->pArray = (int *)0x0;
      }
      if (pVVar2->vTable != (Vec_Int_t *)0x0) {
        free(pVVar2->vTable);
        pVVar2->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar2->vNexts != (Vec_Int_t *)0x0) {
      piVar1 = pVVar2->vNexts->pArray;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        pVVar2->vNexts->pArray = (int *)0x0;
      }
      if (pVVar2->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar2->vNexts);
        pVVar2->vNexts = (Vec_Int_t *)0x0;
      }
    }
  }
  if (p->pPars->fCutMin != 0) {
    pVVar2 = p->vTtMem;
    if (-1 < pVVar2->iPage) {
      lVar3 = -1;
      do {
        if (pVVar2->ppPages[lVar3 + 1] != (word *)0x0) {
          free(pVVar2->ppPages[lVar3 + 1]);
          pVVar2->ppPages[lVar3 + 1] = (word *)0x0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar2->iPage);
    }
    if (pVVar2->ppPages != (word **)0x0) {
      free(pVVar2->ppPages);
      pVVar2->ppPages = (word **)0x0;
    }
    if (pVVar2 != (Vec_Mem_t *)0x0) {
      free(pVVar2);
    }
  }
  if (p != (Of_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Of_StoDelete( Of_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    Vec_PtrErase( &p->vPages );
    Vec_IntErase( &p->vCutSets );
    Vec_IntErase( &p->vCutFlows );
    Vec_IntErase( &p->vCutDelays );
    Vec_IntErase( &p->vCutRefs );
    ABC_FREE( p->pObjs );
    // matching
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}